

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O0

void __thiscall Hpipe::Pool<Hpipe::CharItem,_32>::~Pool(Pool<Hpipe::CharItem,_32> *this)

{
  Set *pSVar1;
  int local_2c;
  int i_1;
  Set *p;
  Set *c;
  int i;
  Pool<Hpipe::CharItem,_32> *this_local;
  
  if (this->last != (Set *)0x0) {
    c._4_4_ = this->used;
    while (c._4_4_ != 0) {
      CharItem::~CharItem((CharItem *)(this->last->items + (long)(c._4_4_ + -1) * 0x88));
      c._4_4_ = c._4_4_ + -1;
    }
    pSVar1 = this->last->prev;
    if (this->last != (Set *)0x0) {
      operator_delete(this->last,0x1108);
    }
    while (p = pSVar1, p != (Set *)0x0) {
      pSVar1 = p->prev;
      local_2c = 0x20;
      while (local_2c != 0) {
        CharItem::~CharItem((CharItem *)(p->items + (long)(local_2c + -1) * 0x88));
        local_2c = local_2c + -1;
      }
      if (p != (Set *)0x0) {
        operator_delete(p,0x1108);
      }
    }
  }
  return;
}

Assistant:

~Pool() {
        if ( last ) {
            // delete the last
            for( int i = used; i--; )
                reinterpret_cast<T *>( last->items + sizeof( T ) * i )->~T();

            // previous items
            Set *c = last->prev;
            delete last;
            while( c ) {
                Set *p = c->prev;
                for( int i = s; i--; )
                    reinterpret_cast<T *>( c->items + sizeof( T ) * i )->~T();
                delete c;
                c = p;
            }
        }
    }